

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtract.hpp
# Opt level: O2

uint duckdb::SubtractOperatorOverflowCheck::Operation<unsigned_int,unsigned_int,unsigned_int>
               (uint left,uint right)

{
  OutOfRangeException *this;
  PhysicalType type;
  allocator local_99;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  if ((right <= left) && ((ulong)left - (ulong)right >> 0x20 == 0)) {
    return (uint)((ulong)left - (ulong)right);
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Overflow in subtraction of %s (%s - %s)!",&local_99);
  TypeIdToString_abi_cxx11_(&local_58,(duckdb *)0x6,type);
  std::__cxx11::to_string(&local_78,left);
  std::__cxx11::to_string(&local_98,right);
  OutOfRangeException::
  OutOfRangeException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (this,&local_38,&local_58,&local_78,&local_98);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA left, TB right) {
		TR result;
		if (!TrySubtractOperator::Operation(left, right, result)) {
			throw OutOfRangeException("Overflow in subtraction of %s (%s - %s)!", TypeIdToString(GetTypeId<TA>()),
			                          NumericHelper::ToString(left), NumericHelper::ToString(right));
		}
		return result;
	}